

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O2

void gf128_mul_uint64(uint64_t *result,uint64_t *arg1,uint64_t *arg2)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar2 = *arg1;
  uVar1 = arg1[1];
  uVar3 = arg2[1];
  uVar5 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
          (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
          (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  iVar6 = 0x40;
  uVar3 = 0;
  uVar4 = 0;
  uVar1 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
          (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
          (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  uVar2 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
          (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
          (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
    uVar7 = -(ulong)((uint)uVar5 & 1);
    uVar3 = uVar3 ^ uVar7 & uVar1;
    uVar4 = uVar4 ^ uVar7 & uVar2;
    uVar7 = uVar2 << 1 | uVar1 >> 0x3f;
    uVar5 = uVar5 >> 1;
    uVar1 = uVar1 * 2;
    bVar8 = (long)uVar2 < 0;
    uVar2 = uVar7;
    if (bVar8) {
      uVar1 = uVar1 ^ 0x87;
    }
  }
  uVar5 = *arg2;
  uVar5 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
          (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
          (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
  iVar6 = 0x3f;
  while( true ) {
    uVar7 = -(ulong)((uint)uVar5 & 1);
    uVar3 = uVar7 & uVar1 ^ uVar3;
    uVar4 = uVar7 & uVar2 ^ uVar4;
    bVar8 = iVar6 == 0;
    iVar6 = iVar6 + -1;
    if (bVar8) break;
    uVar7 = uVar2 << 1 | uVar1 >> 0x3f;
    uVar5 = uVar5 >> 1;
    uVar1 = uVar1 * 2;
    bVar8 = (long)uVar2 < 0;
    uVar2 = uVar7;
    if (bVar8) {
      uVar1 = uVar1 ^ 0x87;
    }
  }
  *result = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
            (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
            (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  result[1] = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18
              | (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18
              | (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  return;
}

Assistant:

static void gf128_mul_uint64 (uint64_t *result, uint64_t *arg1, uint64_t *arg2)
{
	int i = 0;
	register uint64_t t, X0, X1;
	uint64_t Z0 = 0, Z1 = 0;

#ifdef L_ENDIAN
	X0 = BSWAP64(*(arg1 + 1));
	X1 = BSWAP64(*arg1);
#else
	X0 = *(arg1 + 1);
	X1 = *arg1;
#endif

	//first 64 bits of arg1
#ifdef L_ENDIAN
	t = BSWAP64(*(arg2 + 1));
#else
	t = *(arg2 + 1);
#endif

	for (i = 0; i < 64; i++) {
		if (t & 0x1) {
			Z0 ^= X0;
			Z1 ^= X1;
		}
		t >>= 1;
		if (X1 & 0x8000000000000000) {
			X1 <<= 1;
			X1 ^= X0>>63;
			X0 <<= 1;
			X0 ^= 0x87;
		}
		else {
			X1 <<= 1;
			X1 ^= X0>>63;
			X0 <<= 1;
		}
	}

	//second 64 bits of arg2
#ifdef L_ENDIAN
	t = BSWAP64(*arg2);
#else
	t = *arg2;
#endif

	for (i = 0; i < 63; i++) {
		if (t & 0x1) {
			Z0 ^= X0;
			Z1 ^= X1;
		}
		t >>= 1;
		if (X1 & 0x8000000000000000) {
			X1 <<= 1;
			X1 ^= X0>>63;
			X0 <<= 1;
			X0 ^= 0x87;
		}
		else {
			X1 <<= 1;
			X1 ^= X0>>63;
			X0 <<= 1;
		}
	}

	if (t & 0x1) {
		Z0 ^= X0;
		Z1 ^= X1;
	}

#ifdef L_ENDIAN
	result[0] = BSWAP64(Z1);
	result[1] = BSWAP64(Z0);
#else
	result[0] = Z1;
	result[1] = Z0;
#endif
}